

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WrapperFieldGenerator
          (WrapperFieldGenerator *this,FieldDescriptor *descriptor,int fieldOrdinal,Options *options
          )

{
  Type TVar1;
  mapped_type *pmVar2;
  Descriptor *this_00;
  bool local_1b5;
  allocator<char> local_151;
  key_type local_150;
  string local_130;
  FieldDescriptor *local_110;
  FieldDescriptor *wrapped_field;
  key_type local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_99;
  key_type local_98;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  Options *local_28;
  Options *options_local;
  FieldDescriptor *pFStack_18;
  int fieldOrdinal_local;
  FieldDescriptor *descriptor_local;
  WrapperFieldGenerator *this_local;
  
  local_28 = options;
  options_local._4_4_ = fieldOrdinal;
  pFStack_18 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,fieldOrdinal,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__WrapperFieldGenerator_006f5f38;
  FieldGeneratorBase::name_abi_cxx11_(&local_68,&this->super_FieldGeneratorBase);
  std::operator+(&local_48,&local_68,"_ != null");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"has_property_check",&local_99);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_98);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  FieldGeneratorBase::name_abi_cxx11_(&local_e0,&this->super_FieldGeneratorBase);
  std::operator+(&local_c0,&local_e0,"_ == null");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"has_not_property_check",
             (allocator<char> *)((long)&wrapped_field + 7));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_100);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&wrapped_field + 7));
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  this_00 = FieldDescriptor::message_type(pFStack_18);
  local_110 = Descriptor::field(this_00,0);
  TVar1 = FieldDescriptor::type(local_110);
  local_1b5 = false;
  if (TVar1 != TYPE_STRING) {
    TVar1 = FieldDescriptor::type(local_110);
    local_1b5 = TVar1 != TYPE_BYTES;
  }
  this->is_value_type = local_1b5;
  if ((this->is_value_type & 1U) != 0) {
    FieldGeneratorBase::type_name_abi_cxx11_(&local_130,&this->super_FieldGeneratorBase,local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"nonnullable_type_name",&local_151);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&(this->super_FieldGeneratorBase).variables_,&local_150);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_130);
  }
  return;
}

Assistant:

WrapperFieldGenerator::WrapperFieldGenerator(const FieldDescriptor* descriptor,
                                       int fieldOrdinal, const Options *options)
    : FieldGeneratorBase(descriptor, fieldOrdinal, options) {
  variables_["has_property_check"] = name() + "_ != null";
  variables_["has_not_property_check"] = name() + "_ == null";
  const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
  is_value_type = wrapped_field->type() != FieldDescriptor::TYPE_STRING &&
      wrapped_field->type() != FieldDescriptor::TYPE_BYTES;
  if (is_value_type) {
    variables_["nonnullable_type_name"] = type_name(wrapped_field);
  }
}